

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

void * __thiscall
btHashedOverlappingPairCache::removeOverlappingPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  long lVar1;
  btBroadphasePair *pbVar2;
  void *pvVar3;
  int *piVar4;
  btOverlappingPairCallback *pbVar5;
  btBroadphaseProxy *pbVar6;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar7;
  int proxyId1;
  uint uVar8;
  int iVar9;
  int iVar10;
  int proxyId2;
  long lVar11;
  int iVar12;
  ulong uVar13;
  btBroadphaseProxy *pbVar14;
  int iVar15;
  btBroadphasePair *pbVar16;
  
  gRemovePairs = gRemovePairs + 1;
  pbVar14 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar14 = proxy0;
    proxy0 = proxy1;
  }
  uVar8 = pbVar14->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar8 = ~(uVar8 << 0xf) + uVar8;
  uVar8 = ((int)uVar8 >> 10 ^ uVar8) * 9;
  uVar8 = (int)uVar8 >> 6 ^ uVar8;
  uVar8 = ~(uVar8 << 0xb) + uVar8;
  uVar13 = (long)(int)((int)uVar8 >> 0x10 ^ uVar8) &
           (long)(this->m_overlappingPairArray).m_capacity - 1U;
  iVar12 = (this->m_hashTable).m_data[uVar13];
  if (iVar12 != -1) {
    pbVar2 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pbVar2[iVar12].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pbVar16 = pbVar2 + iVar12, pbVar16->m_pProxy1->m_uniqueId == pbVar14->m_uniqueId)) {
        (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
          _vptr_btOverlappingPairCallback[8])(this,pbVar16,dispatcher);
        pvVar3 = (pbVar16->field_3).m_internalInfo1;
        piVar4 = (this->m_hashTable).m_data;
        iVar12 = piVar4[uVar13];
        iVar15 = (int)((ulong)((long)pbVar16 - (long)(this->m_overlappingPairArray).m_data) >> 5);
        if (iVar12 == iVar15) goto LAB_00137d39;
        do {
          iVar9 = iVar12;
          iVar12 = (this->m_next).m_data[iVar9];
        } while (iVar12 != iVar15);
        if (iVar9 == -1) {
LAB_00137d39:
          piVar4[uVar13] = (this->m_next).m_data[iVar15];
        }
        else {
          piVar4 = (this->m_next).m_data;
          piVar4[iVar9] = piVar4[iVar15];
        }
        lVar11 = (long)(this->m_overlappingPairArray).m_size;
        lVar1 = lVar11 + -1;
        pbVar5 = this->m_ghostPairCallback;
        if (pbVar5 != (btOverlappingPairCallback *)0x0) {
          (*pbVar5->_vptr_btOverlappingPairCallback[3])(pbVar5,proxy0,pbVar14,dispatcher);
        }
        iVar12 = (int)lVar1;
        if (iVar12 == iVar15) goto LAB_00137e3c;
        pbVar16 = (this->m_overlappingPairArray).m_data;
        piVar4 = (this->m_hashTable).m_data;
        pbVar2 = pbVar16 + lVar1;
        uVar8 = (pbVar16[lVar1].m_pProxy1)->m_uniqueId << 0x10 |
                (pbVar16[lVar1].m_pProxy0)->m_uniqueId;
        uVar8 = ~(uVar8 << 0xf) + uVar8;
        uVar8 = ((int)uVar8 >> 10 ^ uVar8) * 9;
        uVar8 = (int)uVar8 >> 6 ^ uVar8;
        uVar8 = ~(uVar8 << 0xb) + uVar8;
        uVar13 = (long)(int)((int)uVar8 >> 0x10 ^ uVar8) &
                 (long)(this->m_overlappingPairArray).m_capacity - 1U;
        iVar9 = piVar4[uVar13];
        if (iVar9 == iVar12) {
LAB_00137e04:
          piVar4[uVar13] = (this->m_next).m_data[lVar11 + -1];
        }
        else {
          do {
            iVar10 = iVar9;
            iVar9 = (this->m_next).m_data[iVar10];
          } while (iVar9 != iVar12);
          if (iVar10 == -1) goto LAB_00137e04;
          piVar4 = (this->m_next).m_data;
          piVar4[iVar10] = piVar4[lVar11 + -1];
        }
        pbVar14 = pbVar2->m_pProxy0;
        pbVar6 = pbVar2->m_pProxy1;
        aVar7 = pbVar2->field_3;
        pbVar16[iVar15].m_algorithm = pbVar2->m_algorithm;
        *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar16[iVar15].m_algorithm + 1) =
             aVar7;
        pbVar16[iVar15].m_pProxy0 = pbVar14;
        pbVar16[iVar15].m_pProxy1 = pbVar6;
        piVar4 = (this->m_hashTable).m_data;
        (this->m_next).m_data[iVar15] = piVar4[uVar13];
        piVar4[uVar13] = iVar15;
LAB_00137e3c:
        piVar4 = &(this->m_overlappingPairArray).m_size;
        *piVar4 = *piVar4 + -1;
        return pvVar3;
      }
      iVar12 = (this->m_next).m_data[iVar12];
    } while (iVar12 != -1);
  }
  return (void *)0x0;
}

Assistant:

void* btHashedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1,btDispatcher* dispatcher)
{
	gRemovePairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair,dispatcher);

	void* userData = pair->m_internalInfo1;

	btAssert(pair->m_pProxy0->getUid() == proxyId1);
	btAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}